

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_1::ToAll
                   (string *__return_storage_ptr__,string *input,function<char_(char)> *transform)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 uStack_38;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (input->_M_string_length != 0) {
    uVar4 = 0;
    uStack_38 = in_RAX;
    do {
      uStack_38 = CONCAT17((input->_M_dataplus)._M_p[uVar4],(undefined7)uStack_38);
      if ((transform->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar3 = std::__throw_bad_function_call();
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        _Unwind_Resume(uVar3);
      }
      (*transform->_M_invoker)((_Any_data *)transform,(char *)((long)&uStack_38 + 7));
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar4 = uVar4 + 1;
    } while (uVar4 < input->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToAll(const std::string &input,
                  std::function<char(const char)> transform) {
  std::string s;
  for (size_t i = 0; i < input.length(); i++) { s += transform(input[i]); }
  return s;
}